

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long> *
__thiscall
b_array::detach_item<MultiMap::Pair<std::__cxx11::string,long>>
          (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
           *__return_storage_ptr__,b_array *this,
          Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
          *data,size_t *size)

{
  pointer pcVar1;
  pointer plVar2;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *pPVar3;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  pointer local_68;
  pointer plStack_60;
  pointer local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (data->data !=
      (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long> *
      )0x0) {
    pPVar3 = Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             ::operator[]((Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                           *)this,(size_t)((long)&data->data[-1].values.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 7));
    (__return_storage_ptr__->key)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->key).field_2
    ;
    pcVar1 = (pPVar3->key)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pPVar3->key)._M_string_length);
    std::vector<long,_std::allocator<long>_>::vector
              (&__return_storage_ptr__->values,&pPVar3->values);
    local_48 = 0;
    local_40[0] = 0;
    local_88[0] = local_78;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,local_40,local_40);
    local_68 = (pointer)0x0;
    plStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    pPVar3 = Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             ::operator[]((Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                           *)this,(size_t)data->data);
    std::__cxx11::string::operator=((string *)pPVar3,(string *)local_88);
    plVar2 = (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = local_68;
    (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = plStack_60;
    (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = local_58;
    local_68 = (pointer)0x0;
    plStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    if (plVar2 != (pointer)0x0) {
      operator_delete(plVar2);
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68);
      }
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    local_48 = 0;
    local_40[0] = 0;
    local_88[0] = local_78;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,local_40,local_40);
    local_68 = (pointer)0x0;
    plStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    pPVar3 = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)((long)&data->data[-1].values.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    data->data = pPVar3;
    pPVar3 = Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             ::operator[]((Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                           *)this,(size_t)pPVar3);
    std::__cxx11::string::operator=((string *)pPVar3,(string *)local_88);
    plVar2 = (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = local_68;
    (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = plStack_60;
    (pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = local_58;
    local_68 = (pointer)0x0;
    plStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    if (plVar2 != (pointer)0x0) {
      operator_delete(plVar2);
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68);
      }
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jaasonw[P]Database/include/util/array/array_util.h"
                ,0x4c,
                "T b_array::detach_item(b_array::Array<T> &, size_t &) [T = MultiMap::Pair<std::basic_string<char>, long>]"
               );
}

Assistant:

T detach_item(b_array::Array<T>& data, size_t& size) {
    assert(size > 0);
    T item = data[size - 1];
    data[size] = T();
    data[--size] = T();
    return item;
}